

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O3

optional<tinyusdz::Animatable<tinyusdz::value::normal3f>_> *
tinyusdz::prim::anon_unknown_0::ConvertToAnimatable<tinyusdz::value::normal3f>
          (optional<tinyusdz::Animatable<tinyusdz::value::normal3f>_> *__return_storage_ptr__,
          PrimVar *var)

{
  vtable_type *pvVar1;
  bool bVar2;
  uint32_t uVar3;
  undefined7 extraout_var;
  optional<tinyusdz::value::normal3f> *poVar5;
  ulong uVar6;
  optional<tinyusdz::Animatable<tinyusdz::value::normal3f>_> *extraout_RAX;
  undefined8 uVar7;
  long lVar8;
  ulong uVar9;
  pointer pSVar10;
  optional<tinyusdz::value::normal3f> pv;
  undefined6 local_80;
  undefined2 uStack_7a;
  undefined4 local_78;
  undefined2 local_74;
  TypedTimeSamples<tinyusdz::value::normal3f> local_70;
  optional<tinyusdz::value::normal3f> local_50;
  optional<tinyusdz::value::normal3f> local_40;
  optional<tinyusdz::Animatable<tinyusdz::value::normal3f>_> *poVar4;
  
  local_70._samples.
  super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_70._samples.
  super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
  local_70._dirty = false;
  local_70._samples.
  super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_70._samples.
  super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
  local_70._samples.
  super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
  ._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
  local_80 = 0;
  uStack_7a = 0;
  local_78 = 0;
  local_74 = 0;
  bVar2 = primvar::PrimVar::is_valid(var);
  poVar4 = (optional<tinyusdz::Animatable<tinyusdz::value::normal3f>_> *)
           CONCAT71(extraout_var,bVar2);
  if (bVar2) {
    if (((var->_blocked == false) &&
        (pvVar1 = (var->_value).v_.vtable, pvVar1 != (vtable_type *)0x0)) &&
       ((uVar3 = (*pvVar1->type_id)(), uVar3 == 0 ||
        ((pvVar1 = (var->_value).v_.vtable, pvVar1 != (vtable_type *)0x0 &&
         (uVar3 = (*pvVar1->type_id)(), uVar3 == 1)))))) {
      poVar4 = (optional<tinyusdz::Animatable<tinyusdz::value::normal3f>_> *)0x0;
    }
    else {
      poVar5 = primvar::PrimVar::get_value<tinyusdz::value::normal3f>(&local_40,var);
      poVar4 = (optional<tinyusdz::Animatable<tinyusdz::value::normal3f>_> *)
               CONCAT71((int7)((ulong)poVar5 >> 8),local_40.has_value_);
      if (local_40.has_value_ != false) {
        local_50.contained._7_4_ = local_40.contained._8_4_;
        local_50._3_1_ = SUB81(local_40.contained._0_8_,0);
        local_50.contained._0_7_ = (undefined7)((ulong)local_40.contained._0_8_ >> 8);
        local_80 = (undefined6)local_40.contained._0_8_;
        uStack_7a = (undefined2)((ulong)local_40.contained._0_8_ >> 0x30);
        local_78 = local_40.contained._8_4_;
        local_74 = 1;
      }
    }
    pSVar10 = (var->_ts)._samples.
              super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((var->_ts)._samples.
        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ._M_impl.super__Vector_impl_data._M_finish == pSVar10) {
      if ((char)poVar4 == '\0') goto LAB_0025484c;
      local_70._samples.
      super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
      ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
      local_70._samples.
      super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
      ._M_impl.super__Vector_impl_data._M_start._4_4_ = 0;
      local_70._samples.
      super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
      ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
      local_70._samples.
      super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
      ._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
      poVar4 = (optional<tinyusdz::Animatable<tinyusdz::value::normal3f>_> *)0x0;
      uVar7 = 0;
    }
    else {
      lVar8 = 0;
      uVar9 = 0;
      do {
        if ((var->_ts)._dirty == true) {
          tinyusdz::value::TimeSamples::update(&var->_ts);
          pSVar10 = (var->_ts)._samples.
                    super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        }
        if ((&pSVar10->blocked)[lVar8] == true) {
          TypedTimeSamples<tinyusdz::value::normal3f>::add_blocked_sample
                    (&local_70,*(double *)((long)&pSVar10->t + lVar8));
        }
        else {
          tinyusdz::value::Value::get_value<tinyusdz::value::normal3f>
                    (&local_50,(Value *)((long)&(pSVar10->value).v_.storage + lVar8),false);
          local_40.has_value_ = local_50.has_value_;
          if (local_50.has_value_ != true) {
            __return_storage_ptr__->has_value_ = false;
            *(undefined8 *)&__return_storage_ptr__->contained = 0;
            *(undefined8 *)((long)&__return_storage_ptr__->contained + 8) = 0;
            *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x10) = 0;
            *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x18) = 0;
            *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x20) = 0;
            *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x28) = 0;
            if (local_70._samples.
                super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
              return __return_storage_ptr__;
            }
            operator_delete(local_70._samples.
                            super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            CONCAT71(local_70._samples.
                                     super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                                     local_70._samples.
                                     super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_) -
                            (long)local_70._samples.
                                  super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
            return extraout_RAX;
          }
          local_40.contained._8_4_ = CONCAT13(local_50.contained._11_1_,local_50.contained._8_3_);
          local_40.contained._0_8_ = CONCAT17(local_50.contained._7_1_,local_50.contained._0_7_);
          TypedTimeSamples<tinyusdz::value::normal3f>::add_sample
                    (&local_70,*(double *)((long)&pSVar10->t + lVar8),
                     (normal3f *)&local_40.contained);
        }
        uVar9 = uVar9 + 1;
        pSVar10 = (var->_ts)._samples.
                  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        uVar6 = ((long)(var->_ts)._samples.
                       super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar10 >> 3) *
                -0x3333333333333333;
        lVar8 = lVar8 + 0x28;
      } while (uVar9 < uVar6);
      uVar7 = CONCAT71(local_70._samples.
                       super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                       local_70._samples.
                       super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_);
      poVar4 = (optional<tinyusdz::Animatable<tinyusdz::value::normal3f>_> *)
               CONCAT71((int7)(uVar6 >> 8),local_70._dirty);
    }
    __return_storage_ptr__->has_value_ = true;
    *(ulong *)&__return_storage_ptr__->contained = CONCAT26(uStack_7a,local_80);
    *(ulong *)((long)&__return_storage_ptr__->contained + 6) =
         CONCAT26(local_74,CONCAT42(local_78,uStack_7a));
    *(undefined4 *)((long)&__return_storage_ptr__->contained + 0x10) =
         local_70._samples.
         super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
         ._M_impl.super__Vector_impl_data._M_start._0_4_;
    *(undefined4 *)((long)&__return_storage_ptr__->contained + 0x14) =
         local_70._samples.
         super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
         ._M_impl.super__Vector_impl_data._M_start._4_4_;
    *(undefined4 *)((long)&__return_storage_ptr__->contained + 0x18) =
         local_70._samples.
         super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
         ._M_impl.super__Vector_impl_data._M_finish._0_4_;
    *(undefined4 *)((long)&__return_storage_ptr__->contained + 0x1c) =
         local_70._samples.
         super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
         ._M_impl.super__Vector_impl_data._M_finish._4_4_;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x20) = uVar7;
    *(char *)((long)&__return_storage_ptr__->contained + 0x28) = (char)poVar4;
  }
  else {
LAB_0025484c:
    __return_storage_ptr__->has_value_ = false;
    *(undefined8 *)&__return_storage_ptr__->contained = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x10) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x18) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x20) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x28) = 0;
  }
  return poVar4;
}

Assistant:

static nonstd::optional<Animatable<T>> ConvertToAnimatable(const primvar::PrimVar &var)
{
  Animatable<T> dst;

  if (!var.is_valid()) {
    DCOUT("is_valid failed");
    DCOUT("has_value " << var.has_value());
    DCOUT("has_timesamples " << var.has_timesamples());
    return nonstd::nullopt;
  }

  bool ok = false;

  if (var.has_value()) {

    if (auto pv = var.get_value<T>()) {
      dst.set_default(pv.value());

      ok = true;
      //return std::move(dst);
    }
  }

  if (var.has_timesamples()) {
    for (size_t i = 0; i < var.ts_raw().size(); i++) {
      const value::TimeSamples::Sample &s = var.ts_raw().get_samples()[i];

      // Attribute Block?
      if (s.blocked) {
        dst.add_blocked_sample(s.t);
      } else if (auto pv = s.value.get_value<T>()) {
        dst.add_sample(s.t, pv.value());
      } else {
        // Type mismatch
        DCOUT(i << "/" << var.ts_raw().size() << " type mismatch.");
        return nonstd::nullopt;
      }
    }

    ok = true;
  }

  if (ok) {
    return std::move(dst);
  }

  DCOUT("???");
  return nonstd::nullopt;
}